

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

void __thiscall QTabBar::setCurrentIndex(QTabBar *this,int index)

{
  long lVar1;
  bool bVar2;
  QTabBarPrivate *this_00;
  Tab *lhs;
  ulong uVar3;
  int in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  Tab *tab;
  int oldIndex;
  QTabBarPrivate *d;
  QAccessibleEvent selectionEvent;
  QTabBarPrivate *in_stack_00000058;
  QAccessibleEvent focusEvent;
  QTabBarPrivate *in_stack_ffffffffffffff70;
  int index_00;
  undefined4 in_stack_ffffffffffffff88;
  QWidget *pQVar4;
  QTabBar *in_stack_ffffffffffffff98;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined8 in_stack_ffffffffffffffd0;
  int index_01;
  QTabBarPrivate *in_stack_ffffffffffffffd8;
  int iVar5;
  
  index_01 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  this_00 = d_func((QTabBar *)0x6acee3);
  iVar5 = (int)((ulong)pQVar4 >> 0x20);
  if ((((*(ushort *)&this_00->field_0x2d0 >> 9 & 1) == 0) || (this_00->pressedIndex == -1)) &&
     (this_00->currentIndex != in_ESI)) {
    index_00 = this_00->currentIndex;
    lhs = QTabBarPrivate::at(in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20));
    if (lhs != (Tab *)0x0) {
      this_00->currentIndex = in_ESI;
      tabRect(in_stack_ffffffffffffff98,iVar5);
      QRect::size((QRect *)this_00);
      (**(code **)((long)*(QSize *)in_RDI + 0x1a0))(in_RDI,in_ESI);
      bVar2 = ::operator!=((QSize *)lhs,(QSize *)in_RDI);
      if (bVar2) {
        QTabBarPrivate::layoutTabs(in_stack_00000058);
      }
      QWidget::update(in_RDI);
      bVar2 = QWidget::isVisible((QWidget *)0x6acfd5);
      if (bVar2) {
        QTabBarPrivate::makeVisible(in_stack_ffffffffffffffd8,index_01);
      }
      else {
        *(ushort *)&this_00->field_0x2d0 = *(ushort *)&this_00->field_0x2d0 & 0xfffe | 1;
      }
      bVar2 = QTabBarPrivate::validIndex(this_00,index_00);
      iVar5 = (int)((ulong)this_00 >> 0x20);
      if (bVar2) {
        lhs->lastTab = index_00;
        QTabBarPrivate::layoutTab
                  ((QTabBarPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffff88),iVar5);
      }
      QTabBarPrivate::layoutTab((QTabBarPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffff88),iVar5);
      uVar3 = QAccessible::isActive();
      if ((uVar3 & 1) != 0) {
        bVar2 = QWidget::hasFocus((QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffff88));
        if (bVar2) {
          QAccessibleEvent::QAccessibleEvent
                    ((QAccessibleEvent *)&stack0xffffffffffffffd8,&in_RDI->super_QObject,Focus);
          QAccessibleEvent::setChild((QAccessibleEvent *)&stack0xffffffffffffffd8,in_ESI);
          QAccessible::updateAccessibility((QAccessibleEvent *)&stack0xffffffffffffffd8);
          QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&stack0xffffffffffffffd8);
        }
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        QAccessibleEvent::QAccessibleEvent
                  ((QAccessibleEvent *)&local_48,&in_RDI->super_QObject,Selection);
        QAccessibleEvent::setChild((QAccessibleEvent *)&local_48,in_ESI);
        QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
        QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_48);
      }
      currentChanged((QTabBar *)0x6ad13d,(int)((ulong)in_RDI >> 0x20));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabBar::setCurrentIndex(int index)
{
    Q_D(QTabBar);
    if (d->dragInProgress && d->pressedIndex != -1)
        return;
    if (d->currentIndex == index)
        return;

    int oldIndex = d->currentIndex;
    if (auto tab = d->at(index)) {
        d->currentIndex = index;
        // If the size hint depends on whether the tab is selected (for instance a style
        // sheet rule that sets a bold font on the 'selected' tab) then we need to
        // re-layout the entire tab bar. To minimize the cost, do that only if the
        // size hint changes for the tab that becomes the current tab (the old current tab
        // will most certainly do the same). QTBUG-6905
        if (tabRect(index).size() != tabSizeHint(index))
            d->layoutTabs();
        update();
        if (!isVisible())
            d->layoutDirty = true;
        else
            d->makeVisible(index);
        if (d->validIndex(oldIndex)) {
            tab->lastTab = oldIndex;
            d->layoutTab(oldIndex);
        }
        d->layoutTab(index);
#if QT_CONFIG(accessibility)
        if (QAccessible::isActive()) {
            if (hasFocus()) {
                QAccessibleEvent focusEvent(this, QAccessible::Focus);
                focusEvent.setChild(index);
                QAccessible::updateAccessibility(&focusEvent);
            }
            QAccessibleEvent selectionEvent(this, QAccessible::Selection);
            selectionEvent.setChild(index);
            QAccessible::updateAccessibility(&selectionEvent);
        }
#endif
        emit currentChanged(index);
    }
}